

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

bool duckdb::FileSystem::IsRemoteFile(string *path,string *extension)

{
  pointer pcVar1;
  char *pcVar2;
  string *psVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  undefined1 *__s;
  bool bVar7;
  bool bVar8;
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  string *local_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  bVar8 = true;
  __s = EXTENSION_FILE_PREFIXES;
  lVar6 = 0x480;
  local_58 = extension;
  while( true ) {
    local_78 = local_68;
    pcVar1 = (path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + path->_M_string_length);
    local_50 = local_40;
    sVar5 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar5);
    if (local_70 < local_48) {
      bVar7 = false;
    }
    else if (local_48 == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(local_50,local_78,local_48);
      bVar7 = iVar4 == 0;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    psVar3 = local_58;
    if (bVar7) break;
    __s = __s + 0x60;
    lVar6 = lVar6 + -0x60;
    bVar8 = lVar6 != 0;
    if (!bVar8) {
      return bVar8;
    }
  }
  pcVar2 = (char *)local_58->_M_string_length;
  strlen(__s + 0x30);
  ::std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar2,(ulong)(__s + 0x30));
  return bVar8;
}

Assistant:

bool FileSystem::IsRemoteFile(const string &path, string &extension) {
	for (const auto &entry : EXTENSION_FILE_PREFIXES) {
		if (StringUtil::StartsWith(path, entry.name)) {
			extension = entry.extension;
			return true;
		}
	}
	return false;
}